

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O2

string * __thiscall
libcellml::Printer::PrinterImpl::printEncapsulation
          (string *__return_storage_ptr__,PrinterImpl *this,ComponentPtr *component,IdList *idList,
          bool autoIds)

{
  size_t sVar1;
  size_t sVar2;
  string componentName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  IdList *local_80;
  PrinterImpl *local_78;
  string local_70;
  string local_50;
  
  local_80 = idList;
  local_78 = this;
  NamedEntity::name_abi_cxx11_
            (&local_50,
             (NamedEntity *)
             (component->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"<component_ref",(allocator<char> *)&local_c0);
  if (local_50._M_string_length != 0) {
    std::operator+(&local_a0," component=\"",&local_50);
    std::operator+(&local_c0,&local_a0,"\"");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  ComponentEntity::encapsulationId_abi_cxx11_
            (&local_c0,
             &((component->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr)->super_ComponentEntity);
  std::__cxx11::string::~string((string *)&local_c0);
  if (local_c0._M_string_length == 0) {
    if (!autoIds) goto LAB_00209697;
    makeUniqueId(&local_70,local_80);
    std::operator+(&local_a0," id=\"",&local_70);
    std::operator+(&local_c0,&local_a0,"\"");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  else {
    ComponentEntity::encapsulationId_abi_cxx11_
              (&local_70,
               &((component->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr)->super_ComponentEntity);
    std::operator+(&local_a0," id=\"",&local_70);
    std::operator+(&local_c0,&local_a0,"\"");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_70);
LAB_00209697:
  sVar1 = ComponentEntity::componentCount
                    (&((component->
                       super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                      ->super_ComponentEntity);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  for (sVar2 = 0; sVar1 != sVar2; sVar2 = sVar2 + 1) {
    ComponentEntity::component
              ((ComponentEntity *)&local_a0,
               (size_t)(component->
                       super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
    ;
    printEncapsulation(&local_c0,local_78,(ComponentPtr *)&local_a0,local_80,autoIds);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_a0._M_string_length);
  }
  if (sVar1 != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string Printer::PrinterImpl::printEncapsulation(const ComponentPtr &component, IdList &idList, bool autoIds)
{
    std::string componentName = component->name();
    std::string repr = "<component_ref";
    if (!componentName.empty()) {
        repr += " component=\"" + componentName + "\"";
    }
    if (!component->encapsulationId().empty()) {
        repr += " id=\"" + component->encapsulationId() + "\"";
    } else if (autoIds) {
        repr += " id=\"" + makeUniqueId(idList) + "\"";
    }
    size_t componentCount = component->componentCount();
    if (componentCount > 0) {
        repr += ">";
    } else {
        repr += "/>";
    }
    for (size_t i = 0; i < componentCount; ++i) {
        repr += printEncapsulation(component->component(i), idList, autoIds);
    }
    if (componentCount > 0) {
        repr += "</component_ref>";
    }
    return repr;
}